

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_m2vd_vdpu1.c
# Opt level: O1

MPP_RET hal_m2vd_vdpu1_start(void *hal,HalTaskInfo *task)

{
  undefined8 uVar1;
  MPP_RET MVar2;
  char *fmt;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  
  uVar1 = *(undefined8 *)((long)hal + 0x68);
  local_28 = 0x194;
  local_30 = uVar1;
  MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x90),4,&local_30);
  if (MVar2 == MPP_OK) {
    local_38 = 0x194;
    local_40 = uVar1;
    MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x90),5,&local_40);
    if (MVar2 == MPP_OK) {
      MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x90),0xf,(void *)0x0);
      if (MVar2 == MPP_OK) {
        return MPP_OK;
      }
      _mpp_log_l(2,"hal_m2vd_vdpu1","send cmd failed %d\n","hal_m2vd_vdpu1_start",(ulong)(uint)MVar2
                );
      return MVar2;
    }
    fmt = "set register read failed %d\n";
  }
  else {
    fmt = "set register write failed %d\n";
  }
  _mpp_log_l(2,"hal_m2vd_vdpu1",fmt,"hal_m2vd_vdpu1_start",(ulong)(uint)MVar2);
  return MVar2;
}

Assistant:

MPP_RET hal_m2vd_vdpu1_start(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    M2vdHalCtx *ctx = (M2vdHalCtx *)hal;

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;
        RK_U32 *regs = (RK_U32 *)ctx->regs;
        RK_U32 reg_size = sizeof(M2vdVdpu1Reg_t);

        wr_cfg.reg = regs;
        wr_cfg.size = reg_size;
        wr_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = regs;
        rd_cfg.size = reg_size;
        rd_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    (void)task;
    return ret;
}